

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit_exception.hpp
# Opt level: O0

void __thiscall cppjit::cppjit_exception::~cppjit_exception(cppjit_exception *this)

{
  cppjit_exception *this_local;
  
  ~cppjit_exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit cppjit_exception(const std::string &what_arg) : what_arg(what_arg) {}